

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockUnsizedNestedStructArrayCase::init
          (BlockUnsizedNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 *this_00;
  int size;
  int extraout_EAX;
  StructType *pSVar1;
  BufferBlock *pBVar2;
  int local_340;
  int local_284;
  int lastArrayLen;
  int ndx;
  Random rnd;
  VarType local_258;
  BufferVar local_240;
  VarType local_200;
  BufferVar local_1e8;
  VarType local_1a8;
  BufferVar local_190;
  VarType local_150;
  BufferVar local_138;
  BufferBlock *local_f8;
  BufferBlock *block;
  VarType local_d8;
  VarType local_c0;
  VarType local_a8;
  StructType *local_90;
  StructType *typeT;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockUnsizedNestedStructArrayCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_18 = pSVar1;
  glu::VarType::VarType(&local_30,TYPE_UINT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_30);
  glu::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  glu::VarType::VarType(&local_70,TYPE_FLOAT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_58,&local_70,4);
  glu::StructType::addMember(pSVar1,"b",&local_58);
  glu::VarType::~VarType(&local_58);
  glu::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  glu::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&typeT);
  glu::VarType::~VarType((VarType *)&typeT);
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"T");
  local_90 = pSVar1;
  glu::VarType::VarType(&local_a8,TYPE_FLOAT_MAT4X3,PRECISION_MEDIUMP);
  glu::StructType::addMember(pSVar1,"a",&local_a8);
  glu::VarType::~VarType(&local_a8);
  pSVar1 = local_90;
  glu::VarType::VarType(&local_d8,local_18);
  glu::VarType::VarType(&local_c0,&local_d8,3);
  glu::StructType::addMember(pSVar1,"b",&local_c0);
  glu::VarType::~VarType(&local_c0);
  glu::VarType::~VarType(&local_d8);
  pSVar1 = local_90;
  glu::VarType::VarType((VarType *)&block,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_f8 = pBVar2;
  glu::VarType::VarType(&local_150,local_18);
  bb::BufferVar::BufferVar(&local_138,"s",&local_150,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_138);
  bb::BufferVar::~BufferVar(&local_138);
  glu::VarType::~VarType(&local_150);
  pBVar2 = local_f8;
  glu::VarType::VarType(&local_1a8,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_190,"v",&local_1a8,0);
  bb::BufferBlock::addMember(pBVar2,&local_190);
  bb::BufferVar::~BufferVar(&local_190);
  glu::VarType::~VarType(&local_1a8);
  pBVar2 = local_f8;
  glu::VarType::VarType(&local_200,TYPE_UINT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_1e8,"u",&local_200,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_1e8);
  bb::BufferVar::~BufferVar(&local_1e8);
  glu::VarType::~VarType(&local_200);
  pBVar2 = local_f8;
  this_00 = &rnd.m_rnd.z;
  glu::VarType::VarType((VarType *)this_00,local_90);
  glu::VarType::VarType(&local_258,(VarType *)this_00,-1);
  bb::BufferVar::BufferVar(&local_240,"t",&local_258,0x800);
  bb::BufferBlock::addMember(pBVar2,&local_240);
  bb::BufferVar::~BufferVar(&local_240);
  glu::VarType::~VarType(&local_258);
  glu::VarType::~VarType((VarType *)&rnd.m_rnd.z);
  bb::BufferBlock::setFlags(local_f8,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setInstanceName(local_f8,"block");
    bb::BufferBlock::setArraySize(local_f8,this->m_numInstances);
  }
  de::Random::Random((Random *)&lastArrayLen,0x1ef1);
  local_284 = 0;
  while( true ) {
    if (this->m_numInstances == 0) {
      local_340 = 1;
    }
    else {
      local_340 = this->m_numInstances;
    }
    if (local_340 <= local_284) break;
    size = de::Random::getInt((Random *)&lastArrayLen,1,5);
    bb::BufferBlock::setLastUnsizedArraySize(local_f8,local_284,size);
    local_284 = local_284 + 1;
  }
  de::Random::~Random((Random *)&lastArrayLen);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT4X3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(VarType(&typeS), 3));
		typeT.addMember("c", VarType(glu::TYPE_INT, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("t", VarType(VarType(&typeT), VarType::UNSIZED_ARRAY), ACCESS_READ));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(7921);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}
	}